

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perf_test.cpp
# Opt level: O0

void try_reference(void)

{
  undefined4 *puVar1;
  char *pcVar2;
  ostream *poVar3;
  rep_conflict rVar4;
  double dVar5;
  double Mrps;
  double ns_per_op;
  duration<double,_std::ratio<1L,_1L>_> local_30;
  duration<double,_std::ratio<1L,_1L>_> diff;
  now_t stop;
  uint32_t i;
  size_t COUNT;
  now_t start;
  
  COUNT = (size_t)now();
  stop.__d.__r._4_4_ = 0;
  while( true ) {
    if (0xffffff < stop.__d.__r._4_4_) {
      diff.__r = (rep_conflict)now();
      ns_per_op = (double)std::chrono::operator-
                                    ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                      *)&diff,(time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                               *)&COUNT);
      std::chrono::duration<double,std::ratio<1l,1l>>::
      duration<long,std::ratio<1l,1000000000l>,void>
                ((duration<double,std::ratio<1l,1l>> *)&local_30,
                 (duration<long,_std::ratio<1L,_1000000000L>_> *)&ns_per_op);
      rVar4 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_30);
      dVar5 = (rVar4 * 1000.0 * 1000.0 * 1000.0) / 16777216.0;
      rVar4 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_30);
      pcVar2 = expand_name("try_reference");
      poVar3 = std::operator<<((ostream *)&std::cout,pcVar2);
      poVar3 = std::operator<<(poVar3,": ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar5);
      poVar3 = std::operator<<(poVar3,"ns per operation,\t");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar5 / unit);
      poVar3 = std::operator<<(poVar3," ticks,\t");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,((16777216.0 / rVar4) / 1000.0) / 1000.0);
      poVar3 = std::operator<<(poVar3," Mrps");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return;
    }
    if ((must_throw & 1U) != 0) break;
    stop.__d.__r._4_4_ = stop.__d.__r._4_4_ + 1;
  }
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 0;
  __cxa_throw(puVar1,&int::typeinfo,0);
}

Assistant:

static void __attribute__((noinline))
try_reference()
{
    now_t start = now();
    const size_t COUNT = SIZE;
    for (uint32_t i = 0; i < COUNT; i++)
    {
        if (must_throw)
            throw 0;
    }
    now_t stop = now();

    std::chrono::duration<double> diff = stop - start;
    double ns_per_op = diff.count() * 1000 * 1000 * 1000 / COUNT;
    double Mrps = COUNT / diff.count() / 1000 / 1000;
    std::cout << NAME << ": " << ns_per_op << "ns per operation,\t"
              << (ns_per_op / unit) << " ticks,\t"
              << Mrps << " Mrps" << std::endl;

}